

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_column_data_scan.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalColumnDataScan::BuildPipelines
          (PhysicalColumnDataScan *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  PhysicalOperatorType PVar1;
  optional_ptr<duckdb::PhysicalOperator,_true> oVar2;
  bool bVar3;
  PipelineBuildState *this_00;
  type pPVar4;
  InternalException *this_01;
  __hash_code __code;
  shared_ptr<duckdb::Pipeline,_true> delim_dependency;
  optional_ptr<duckdb::PhysicalOperator,_true> delim_sink;
  undefined1 local_50 [32];
  optional_ptr<duckdb::PhysicalOperator,_true> local_30;
  
  this_00 = MetaPipeline::GetState(meta_pipeline);
  PVar1 = (this->super_PhysicalOperator).type;
  if (1 < PVar1 - 0x19) {
    local_50._0_8_ = this;
    if (PVar1 == CTE_SCAN) {
      ::std::
      _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_find_before_node
                (&(this_00->cte_dependencies)._M_h,
                 (ulong)this % (this_00->cte_dependencies)._M_h._M_bucket_count,(key_type *)local_50
                 ,(__hash_code)this);
      enable_shared_from_this<duckdb::Pipeline>::shared_from_this
                ((enable_shared_from_this<duckdb::Pipeline> *)local_50);
      pPVar4 = shared_ptr<duckdb::Pipeline,_true>::operator*
                         ((shared_ptr<duckdb::Pipeline,_true> *)local_50);
      PipelineBuildState::GetPipelineSink(this_00,pPVar4);
      Pipeline::AddDependency(current,(shared_ptr<duckdb::Pipeline,_true> *)local_50);
      PipelineBuildState::SetPipelineSource(this_00,current,&this->super_PhysicalOperator);
    }
    else {
      if (PVar1 != DELIM_SCAN) goto LAB_015a1cb6;
      ::std::
      _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_find_before_node
                ((_Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this_00,(ulong)this % (this_00->delim_join_dependencies)._M_h._M_bucket_count,
                 (key_type *)local_50,(__hash_code)this);
      enable_shared_from_this<duckdb::Pipeline>::shared_from_this
                ((enable_shared_from_this<duckdb::Pipeline> *)local_50);
      pPVar4 = shared_ptr<duckdb::Pipeline,_true>::operator*
                         ((shared_ptr<duckdb::Pipeline,_true> *)local_50);
      local_30 = PipelineBuildState::GetPipelineSink(this_00,pPVar4);
      optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_30);
      oVar2.ptr = local_30.ptr;
      Pipeline::AddDependency(current,(shared_ptr<duckdb::Pipeline,_true> *)local_50);
      PipelineBuildState::SetPipelineSource
                (this_00,current,*(PhysicalOperator **)&oVar2.ptr[1].type);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    }
    return;
  }
  bVar3 = MetaPipeline::HasRecursiveCTE(meta_pipeline);
  if (!bVar3) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._0_8_ = local_50 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Recursive CTE scan found without recursive CTE node","");
    InternalException::InternalException(this_01,(string *)local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_015a1cb6:
  PipelineBuildState::SetPipelineSource(this_00,current,&this->super_PhysicalOperator);
  return;
}

Assistant:

void PhysicalColumnDataScan::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	// check if there is any additional action we need to do depending on the type
	auto &state = meta_pipeline.GetState();
	switch (type) {
	case PhysicalOperatorType::DELIM_SCAN: {
		auto entry = state.delim_join_dependencies.find(*this);
		D_ASSERT(entry != state.delim_join_dependencies.end());
		// this chunk scan introduces a dependency to the current pipeline
		// namely a dependency on the duplicate elimination pipeline to finish
		auto delim_dependency = entry->second.get().shared_from_this();
		auto delim_sink = state.GetPipelineSink(*delim_dependency);
		D_ASSERT(delim_sink);
		D_ASSERT(delim_sink->type == PhysicalOperatorType::LEFT_DELIM_JOIN ||
		         delim_sink->type == PhysicalOperatorType::RIGHT_DELIM_JOIN);
		auto &delim_join = delim_sink->Cast<PhysicalDelimJoin>();
		current.AddDependency(delim_dependency);
		state.SetPipelineSource(current, delim_join.distinct.Cast<PhysicalOperator>());
		return;
	}
	case PhysicalOperatorType::CTE_SCAN: {
		auto entry = state.cte_dependencies.find(*this);
		D_ASSERT(entry != state.cte_dependencies.end());
		// this chunk scan introduces a dependency to the current pipeline
		// namely a dependency on the CTE pipeline to finish
		auto cte_dependency = entry->second.get().shared_from_this();
		auto cte_sink = state.GetPipelineSink(*cte_dependency);
		(void)cte_sink;
		D_ASSERT(cte_sink);
		D_ASSERT(cte_sink->type == PhysicalOperatorType::CTE);
		current.AddDependency(cte_dependency);
		state.SetPipelineSource(current, *this);
		return;
	}
	case PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN:
	case PhysicalOperatorType::RECURSIVE_CTE_SCAN:
		if (!meta_pipeline.HasRecursiveCTE()) {
			throw InternalException("Recursive CTE scan found without recursive CTE node");
		}
		break;
	default:
		break;
	}
	D_ASSERT(children.empty());
	state.SetPipelineSource(current, *this);
}